

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scene.cpp
# Opt level: O1

void __thiscall GroundScene::GroundScene(GroundScene *this,int tx,int ty)

{
  int i;
  long lVar1;
  Plant *(*papPVar2) [10];
  int (*paiVar3) [10];
  long lVar4;
  
  (this->objects).super__Vector_base<Object_*,_std::allocator<Object_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->objects).super__Vector_base<Object_*,_std::allocator<Object_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->objects).super__Vector_base<Object_*,_std::allocator<Object_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->x = tx;
  this->y = ty;
  this->w = 0x4b;
  this->h = 0x25;
  this->selectX = 0;
  this->selectY = 0;
  this->count = 0;
  initSun(this);
  this->sunVectorN = 0x32;
  lVar1 = 0;
  this->randSortCount = 0;
  this->isRandSort = false;
  this->score = 0;
  papPVar2 = this->plants;
  paiVar3 = this->specialColor;
  this->level = 0;
  this->genZombieCount = 0;
  this->genZombieSpeed = 0;
  this->genZombieNumber = 0;
  do {
    this->weedKiller[lVar1] = true;
    lVar4 = 0;
    do {
      (*papPVar2)[lVar4] = (Plant *)0x0;
      (*paiVar3)[lVar4] = 0xf;
      lVar4 = lVar4 + 1;
    } while (lVar4 != 10);
    lVar1 = lVar1 + 1;
    papPVar2 = papPVar2 + 1;
    paiVar3 = paiVar3 + 1;
  } while (lVar1 != 5);
  return;
}

Assistant:

GroundScene::GroundScene(int tx, int ty){
	x = tx; y = ty; w = GSW; h = GSH;
	selectX = 0;
	selectY = 0;
	count = 0;
	initSun();
	sunVectorN = GSBH*GSBW;
	randSortCount = 0;
	isRandSort = 0;
	score = 0;
	level = 0;
	genZombieCount = 0;
	genZombieSpeed = 0;
	genZombieNumber = 0;
	for(int i = 0; i < GSBH; ++i){
		weedKiller[i] = 1;
		for(int j = 0; j < GSBW; ++j){
			plants[i][j] = NULL;
			specialColor[i][j] = WHITE;
		}
	}

	/* objects.push_back(new Suns(x+1+3, y+1)); */
	/* objects.push_back(new SunFlower(x+1+3+1, y+1+2)); */
	/* objects.push_back(new PeaShooter(x+1+3+1, y+1+2+BLOCKW)); */
	/* objects.push_back(new NewsZombie(x+1+3+7*BLOCKW+1, y+1+2)); */
	/* objects.push_back(new NewsZombie(x+1+3+8*BLOCKW+1, y+1+2)); */
	/* objects.push_back(new DoorZombie(x+1+3+8*BLOCKW+1, y+1+2+1*BLOCKW)); */
	/* objects.push_back(new DancingZombie(x+1+3+8*BLOCKW+1, y+1+2+0*BLOCKW)); */
	/* weedKiller[1] = 0; */
	/* objects.push_back(new BucketZombie(x+1+3+6*BLOCKW+1, y+1+2+0*BLOCKW)); */
	/* objects.push_back(new BucketZombie(x+1+3+6*BLOCKW+1, y+1+2+2*BLOCKW)); */
	/* objects.push_back(new NormalZombie(x+1+3+7*BLOCKW+1+2, y+1+2+1*BLOCKW)); */
	/* objects.push_back(new NormalZombie(x+1+3+6*BLOCKW+1+2, y+1+2+0*BLOCKW)); */
	/* objects.push_back(new NormalZombie(x+1+3+6*BLOCKW+1+2, y+1+2+2*BLOCKW)); */
	/* objects.push_back(new BucketZombie(x+1+3+8*BLOCKW+1, y+1+2+1*BLOCKW)); */
	/* objects.push_back(new NormalZombie(x+1+3+8*BLOCKW+1+2, y+1+2+1*BLOCKW)); */
	/* objects.push_back(new BucketZombie(x+1+3+7*BLOCKW+1, y+1+2+2*BLOCKW)); */
	/* objects.push_back(new BucketZombie(x+1+3+8*BLOCKW+1, y+1+2+2*BLOCKW)); */
	/* genPlant(4, 1, OBJ_TYPE_POTATOMINE); */
	/* genPlant(0, 1, OBJ_TYPE_SNOWPEA); */
	/* genPlant(0, 1, OBJ_TYPE_MELONPULT); */
	/* genPlant(6, 0, OBJ_TYPE_SPIKEWEED); */
	/* genPlant(6, 2, OBJ_TYPE_WALLNUT); */
	/* genPlant(6, 1, OBJ_TYPE_GARLIC); */
	/* genPlant(0, 0, OBJ_TYPE_PEASHOOTER); */
	/* genPlant(0, 2, OBJ_TYPE_SNOWPEA); */
	/* genPlant(6, 1, OBJ_TYPE_SPIKEWEED); */
	/* genPlant(0, 2, OBJ_TYPE_SNOWMELON); */
	/* genPlant(0, 0, OBJ_TYPE_PEASHOOTER); */
}